

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

bool __thiscall
ON_NurbsCurve::GetNextDiscontinuity
          (ON_NurbsCurve *this,continuity c,double t0,double t1,double *t,int *hint,int *dtype,
          double cos_angle_tolerance,double curvature_tolerance)

{
  bool bVar1;
  bool bVar2;
  ON_3dVector Km_00;
  ON_3dVector Km_01;
  ON_3dVector Kp_00;
  ON_3dVector Kp_01;
  continuity c_00;
  bool bVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  double dVar7;
  bool local_271;
  bool local_26a;
  bool local_262;
  bool local_251;
  undefined1 local_250 [7];
  bool rc;
  ON_3dVector local_238;
  double local_220;
  double local_218;
  double local_210;
  double local_208;
  double local_200;
  double local_1f8;
  double local_1f0;
  double local_1e8;
  double local_1e0;
  double local_1d8;
  double local_1d0;
  double local_1c8;
  bool local_1b9;
  double *pdStack_1b8;
  bool bIsCurvatureContinuous;
  double search_domain [2];
  int ii_1;
  int ii;
  bool bSpanIsLinear;
  bool bLineWiggleTest;
  double segtol;
  int local_180;
  int delta;
  int delta_ki;
  bool bTestTangent;
  bool bTestKappa;
  int iStack_174;
  bool bEv2ndDer;
  continuity input_c;
  int ki;
  ON_3dVector Kp;
  ON_3dVector Km;
  ON_3dVector Tp;
  ON_3dVector Tm;
  ON_3dVector D2p;
  ON_3dVector D2m;
  ON_3dVector D1p;
  ON_3dVector D1m;
  ON_3dPoint Pp;
  ON_3dPoint Pm;
  double tmp_t;
  double d;
  int tmp_dtype;
  int tmp_hint;
  double is_linear_min_length;
  double is_linear_tolerance;
  double curvature_tolerance_local;
  double cos_angle_tolerance_local;
  int *dtype_local;
  int *hint_local;
  double *t_local;
  double t1_local;
  double t0_local;
  ON_NurbsCurve *pOStack_18;
  continuity c_local;
  ON_NurbsCurve *this_local;
  
  is_linear_min_length = 1e-08;
  _tmp_dtype = 0x3e45798ee2308c3a;
  d._4_4_ = 0;
  d._0_4_ = 0;
  Kp.z = ON_3dVector::NanVector.x;
  Km.x = ON_3dVector::NanVector.y;
  Km.y = ON_3dVector::NanVector.z;
  _input_c = ON_3dVector::NanVector.x;
  Kp.x = ON_3dVector::NanVector.y;
  Kp.y = ON_3dVector::NanVector.z;
  dtype_local = hint;
  if (hint == (int *)0x0) {
    dtype_local = (int *)((long)&d + 4);
  }
  cos_angle_tolerance_local = (double)dtype;
  if (dtype == (int *)0x0) {
    cos_angle_tolerance_local = (double)&d;
  }
  hint_local = (int *)t;
  if (t == (double *)0x0) {
    hint_local = (int *)&Pm.z;
  }
  if (c == C0_continuous) {
    this_local._7_1_ = false;
  }
  else {
    is_linear_tolerance = curvature_tolerance;
    curvature_tolerance_local = cos_angle_tolerance;
    t_local = (double *)t1;
    t1_local = t0;
    t0_local._4_4_ = c;
    pOStack_18 = this;
    if (c == C0_locus_continuous) {
      this_local._7_1_ =
           ON_Curve::GetNextDiscontinuity
                     (&this->super_ON_Curve,C0_locus_continuous,t0,t1,(double *)hint_local,
                      dtype_local,(int *)cos_angle_tolerance_local,cos_angle_tolerance,
                      curvature_tolerance);
    }
    else if ((t0 != t1) || (NAN(t0) || NAN(t1))) {
      if (this->m_order < 3) {
        t0_local._4_4_ = ON::PolylineContinuity(c);
      }
      c_00 = t0_local._4_4_;
      t0_local._4_4_ = ON::ParametricContinuity(t0_local._4_4_);
      if (((t0_local._4_4_ == C2_continuous) || (t0_local._4_4_ == G2_continuous)) ||
         (bVar2 = false, t0_local._4_4_ == Gsmooth_continuous)) {
        bVar2 = 2 < this->m_order;
      }
      bVar5 = t0_local._4_4_ != C2_continuous;
      local_262 = bVar2 && bVar5;
      bVar6 = t0_local._4_4_ == G1_continuous;
      local_180 = 1;
      iVar4 = 2;
      if (bVar2) {
        iVar4 = 3;
      }
      segtol._4_4_ = iVar4 - this->m_order;
      if (t0_local._4_4_ == Cinfinity_continuous) {
        segtol._4_4_ = 0;
      }
      iVar4 = 1;
      if ((double)t_local < t1_local) {
        iVar4 = -1;
      }
      iStack_174 = ON_NurbsSpanIndex(this->m_order,this->m_cv_count,this->m_knot,t1_local,iVar4,
                                     *dtype_local);
      dVar7 = (ABS(this->m_knot[iStack_174]) + ABS(this->m_knot[iStack_174 + 1]) +
              ABS(this->m_knot[iStack_174 + 1] - this->m_knot[iStack_174])) * 1.490116119385e-08;
      bVar1 = false;
      if (t0_local._4_4_ == Gsmooth_continuous) {
        bVar1 = 3 < this->m_order;
      }
      ii_1._2_1_ = false;
      if ((double)t_local <= t1_local) {
        iVar4 = iStack_174 + this->m_order + -2;
        if (((this->m_knot[iVar4] <= t1_local && t1_local != this->m_knot[iVar4]) &&
            ((double)t_local < this->m_knot[iVar4])) &&
           ((t1_local - this->m_knot[iVar4] <= dVar7 && (this->m_order + -2 < iVar4)))) {
          t1_local = this->m_knot[iVar4];
          iStack_174 = ON_NurbsSpanIndex(this->m_order,this->m_cv_count,this->m_knot,t1_local,-1,
                                         *dtype_local);
        }
        if (bVar1) {
          ii_1._2_1_ = SpanIsLinear(this,iStack_174,1e-08,1e-08);
        }
        *dtype_local = iStack_174;
        iStack_174 = this->m_order + -2 + iStack_174;
        while( true ) {
          bVar3 = false;
          if (this->m_order + -2 < iStack_174) {
            bVar3 = t1_local <= this->m_knot[iStack_174];
          }
          if (!bVar3) break;
          iStack_174 = iStack_174 + -1;
        }
        if (this->m_order + -2 < iStack_174) {
          local_180 = -1;
          segtol._4_4_ = -segtol._4_4_;
          goto LAB_007fbdf4;
        }
        if (((c_00 == t0_local._4_4_) ||
            (t1_local < this->m_knot[this->m_order + -2] ||
             t1_local == this->m_knot[this->m_order + -2])) ||
           (this->m_knot[this->m_order + -2] <= (double)t_local)) {
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ =
               ON_Curve::GetNextDiscontinuity
                         (&this->super_ON_Curve,c_00,t1_local,(double)t_local,(double *)hint_local,
                          dtype_local,(int *)cos_angle_tolerance_local,curvature_tolerance_local,
                          is_linear_tolerance);
        }
      }
      else {
        iVar4 = iStack_174 + this->m_order;
        if ((((t1_local < this->m_knot[iVar4 + -1]) &&
             (this->m_knot[iVar4 + -1] <= (double)t_local &&
              (double)t_local != this->m_knot[iVar4 + -1])) &&
            (this->m_knot[iVar4 + -1] - t1_local <= dVar7)) && (iVar4 < this->m_cv_count)) {
          t1_local = this->m_knot[iVar4 + -1];
          iStack_174 = ON_NurbsSpanIndex(this->m_order,this->m_cv_count,this->m_knot,t1_local,1,
                                         *dtype_local);
        }
        if (bVar1) {
          ii_1._2_1_ = SpanIsLinear(this,iStack_174,1e-08,1e-08);
        }
        *dtype_local = iStack_174;
        iStack_174 = this->m_order + -2 + iStack_174;
        while( true ) {
          bVar3 = false;
          if (iStack_174 < this->m_cv_count + -1) {
            bVar3 = this->m_knot[iStack_174] <= t1_local;
          }
          if (!bVar3) break;
          iStack_174 = iStack_174 + 1;
        }
        if (iStack_174 < this->m_cv_count + -1) {
LAB_007fbdf4:
          if ((double)t_local < t1_local) {
            pdStack_1b8 = t_local;
            search_domain[0] = t1_local;
          }
          else {
            pdStack_1b8 = (double *)t1_local;
            search_domain[0] = (double)t_local;
          }
          while( true ) {
            bVar3 = false;
            if ((double)pdStack_1b8 < this->m_knot[iStack_174]) {
              bVar3 = this->m_knot[iStack_174] < search_domain[0];
            }
            if (!bVar3) break;
            if (local_180 < 1) {
              while( true ) {
                bVar3 = false;
                if (this->m_order + -2 < iStack_174) {
                  bVar3 = this->m_knot[iStack_174] == this->m_knot[iStack_174 + -1];
                }
                if (!bVar3) break;
                iStack_174 = iStack_174 + -1;
              }
              if (iStack_174 <= this->m_order + -2) break;
            }
            else {
              while( true ) {
                bVar3 = false;
                if (iStack_174 < this->m_cv_count + -1) {
                  bVar3 = this->m_knot[iStack_174] == this->m_knot[iStack_174 + 1];
                }
                if (!bVar3) break;
                iStack_174 = iStack_174 + 1;
              }
              if (this->m_cv_count + -1 <= iStack_174) break;
            }
            if ((this->m_knot[iStack_174] == this->m_knot[iStack_174 + segtol._4_4_]) &&
               (!NAN(this->m_knot[iStack_174]) && !NAN(this->m_knot[iStack_174 + segtol._4_4_]))) {
              if (t0_local._4_4_ == Cinfinity_continuous) {
                *(undefined4 *)cos_angle_tolerance_local = 3;
                *(double *)hint_local = this->m_knot[iStack_174];
                return true;
              }
              if (bVar2) {
                ON_Curve::Ev2Der(&this->super_ON_Curve,this->m_knot[iStack_174],(ON_3dPoint *)&Pp.z,
                                 (ON_3dVector *)&D1p.z,(ON_3dVector *)&D2p.z,-1,dtype_local);
                ON_Curve::Ev2Der(&this->super_ON_Curve,this->m_knot[iStack_174],(ON_3dPoint *)&D1m.z
                                 ,(ON_3dVector *)&D2m.z,(ON_3dVector *)&Tm.z,1,dtype_local);
              }
              else {
                ON_Curve::Ev1Der(&this->super_ON_Curve,this->m_knot[iStack_174],(ON_3dPoint *)&Pp.z,
                                 (ON_3dVector *)&D1p.z,-1,dtype_local);
                ON_Curve::Ev1Der(&this->super_ON_Curve,this->m_knot[iStack_174],(ON_3dPoint *)&D1m.z
                                 ,(ON_3dVector *)&D2m.z,1,dtype_local);
              }
              if (bVar2 && bVar5 || bVar6) {
                if (bVar2 && bVar5) {
                  ON_EvCurvature((ON_3dVector *)&D1p.z,(ON_3dVector *)&D2p.z,(ON_3dVector *)&Tp.z,
                                 (ON_3dVector *)&Kp.z);
                  ON_EvCurvature((ON_3dVector *)&D2m.z,(ON_3dVector *)&Tm.z,(ON_3dVector *)&Km.z,
                                 (ON_3dVector *)&input_c);
                }
                else {
                  Tp.z = D1p.z;
                  Tm.x = D1m.x;
                  Tm.y = D1m.y;
                  Km.z = D2m.z;
                  Tp.x = D1p.x;
                  Tp.y = D1p.y;
                  ON_3dVector::Unitize((ON_3dVector *)&Tp.z);
                  ON_3dVector::Unitize((ON_3dVector *)&Km.z);
                }
                dVar7 = ON_3dVector::operator*((ON_3dVector *)&Tp.z,(ON_3dVector *)&Km.z);
                if (dVar7 < curvature_tolerance_local) {
                  *(undefined4 *)cos_angle_tolerance_local = 1;
                  *(double *)hint_local = this->m_knot[iStack_174];
                  return true;
                }
                if (local_262) {
                  if (t0_local._4_4_ == Gsmooth_continuous) {
                    local_1d8 = Kp.z;
                    local_1d0 = Km.x;
                    local_1c8 = Km.y;
                    local_1f0 = _input_c;
                    local_1e8 = Kp.x;
                    local_1e0 = Kp.y;
                    Km_00.y = Km.x;
                    Km_00.x = Kp.z;
                    Km_00.z = Km.y;
                    Kp_00.y = Kp.x;
                    Kp_00.x = _input_c;
                    Kp_00.z = Kp.y;
                    local_26a = ON_IsGsmoothCurvatureContinuous
                                          (Km_00,Kp_00,curvature_tolerance_local,is_linear_tolerance
                                          );
                  }
                  else {
                    local_208 = Kp.z;
                    local_200 = Km.x;
                    local_1f8 = Km.y;
                    local_220 = _input_c;
                    local_218 = Kp.x;
                    local_210 = Kp.y;
                    Km_01.y = Km.x;
                    Km_01.x = Kp.z;
                    Km_01.z = Km.y;
                    Kp_01.y = Kp.x;
                    Kp_01.x = _input_c;
                    Kp_01.z = Kp.y;
                    local_26a = ON_IsG2CurvatureContinuous
                                          (Km_01,Kp_01,curvature_tolerance_local,is_linear_tolerance
                                          );
                  }
                  local_1b9 = local_26a;
                  if (((local_26a != false) && (t0_local._4_4_ == Gsmooth_continuous)) &&
                     (bVar3 = ON_NurbsArcToArcTransitionIsNotGsmooth
                                        (this,iStack_174,curvature_tolerance_local,
                                         is_linear_tolerance), bVar3)) {
                    local_1b9 = false;
                  }
                  if ((local_1b9 & 1U) == 0) {
                    *(undefined4 *)cos_angle_tolerance_local = 2;
                    *(double *)hint_local = this->m_knot[iStack_174];
                    return true;
                  }
                  if (bVar1) {
                    if (local_180 < 0) {
                      local_271 = SpanIsLinear(this,(iStack_174 - this->m_order) + 1,1e-08,1e-08);
                    }
                    else {
                      local_271 = SpanIsLinear(this,(iStack_174 - this->m_order) + 2,1e-08,1e-08);
                    }
                    if (ii_1._2_1_ != local_271) {
                      *(undefined4 *)cos_angle_tolerance_local = 3;
                      *(double *)hint_local = this->m_knot[iStack_174];
                      return true;
                    }
                  }
                }
              }
              else {
                ON_3dVector::operator-(&local_238,(ON_3dVector *)&D1p.z,(ON_3dVector *)&D2m.z);
                dVar7 = ON_3dVector::MaximumCoordinate((ON_3dVector *)&D1p.z);
                bVar3 = ON_3dVector::IsTiny(&local_238,dVar7 * 1.490116119385e-08);
                if (((bVar3 ^ 0xffU) & 1) != 0) {
                  *(undefined4 *)cos_angle_tolerance_local = 1;
                  *(double *)hint_local = this->m_knot[iStack_174];
                  return true;
                }
                if (bVar2) {
                  ON_3dVector::operator-
                            ((ON_3dVector *)local_250,(ON_3dVector *)&D2p.z,(ON_3dVector *)&Tm.z);
                  dVar7 = ON_3dVector::MaximumCoordinate((ON_3dVector *)&D2p.z);
                  bVar3 = ON_3dVector::IsTiny((ON_3dVector *)local_250,dVar7 * 1.490116119385e-08);
                  if (((bVar3 ^ 0xffU) & 1) != 0) {
                    *(undefined4 *)cos_angle_tolerance_local = 2;
                    *(double *)hint_local = this->m_knot[iStack_174];
                    return true;
                  }
                }
              }
            }
            iStack_174 = local_180 + iStack_174;
          }
          local_251 = false;
          if (c_00 != t0_local._4_4_) {
            local_251 = ON_Curve::GetNextDiscontinuity
                                  (&this->super_ON_Curve,c_00,t1_local,(double)t_local,
                                   (double *)hint_local,dtype_local,(int *)cos_angle_tolerance_local
                                   ,curvature_tolerance_local,is_linear_tolerance);
          }
          return local_251;
        }
        if (((c_00 == t0_local._4_4_) || (this->m_knot[this->m_cv_count + -1] <= t1_local)) ||
           ((double)t_local < this->m_knot[this->m_cv_count + -1])) {
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ =
               ON_Curve::GetNextDiscontinuity
                         (&this->super_ON_Curve,c_00,t1_local,(double)t_local,(double *)hint_local,
                          dtype_local,(int *)cos_angle_tolerance_local,curvature_tolerance_local,
                          is_linear_tolerance);
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_NurbsCurve::GetNextDiscontinuity( 
                ON::continuity c,
                double t0,
                double t1,
                double* t,
                int* hint,
                int* dtype,
                double cos_angle_tolerance,
                double curvature_tolerance
                ) const
{
  const double is_linear_tolerance = 1.0e-8;  
  const double is_linear_min_length = 1.0e-8;
  int tmp_hint = 0, tmp_dtype=0;
  double d, tmp_t;
  ON_3dPoint Pm, Pp;
  ON_3dVector D1m, D1p, D2m, D2p, Tm, Tp, Km(ON_3dVector::NanVector), Kp(ON_3dVector::NanVector);
  int ki;
  if ( !hint )
    hint = &tmp_hint;
  if ( !dtype )
    dtype = &tmp_dtype;
  if ( !t )
    t = &tmp_t;
  
  if ( c == ON::continuity::C0_continuous )
    return false;
  if ( c == ON::continuity::C0_locus_continuous )
  {
    return ON_Curve::GetNextDiscontinuity( c, t0, t1, t, hint, dtype, 
                                    cos_angle_tolerance, curvature_tolerance );
  }
  if ( t0 == t1 )
    return false;

  // First test for parametric discontinuities.  If none are found
  // then we will look for locus discontinuities at ends
  if ( m_order <= 2 )
    c = ON::PolylineContinuity((int)c); // no need to check 2nd derivatives that are zero
  const ON::continuity input_c = c;
  c = ON::ParametricContinuity((int)c);
  bool bEv2ndDer    = (c == ON::continuity::C2_continuous || c == ON::continuity::G2_continuous || c == ON::continuity::Gsmooth_continuous) && (m_order>2);
  bool bTestKappa   = ( bEv2ndDer && c != ON::continuity::C2_continuous );
  bool bTestTangent = ( bTestKappa || c == ON::continuity::G1_continuous );

  int delta_ki = 1;
  int delta = ((bEv2ndDer) ? 3 : 2) - m_order; // delta <= 0
  if ( ON::continuity::Cinfinity_continuous == c )
    delta = 0;

  ki = ON_NurbsSpanIndex(m_order,m_cv_count,m_knot,t0,(t0>t1)?-1:1,*hint);
  double segtol = (fabs(m_knot[ki]) + fabs(m_knot[ki+1]) + fabs(m_knot[ki+1]-m_knot[ki]))*ON_SQRT_EPSILON;

  const bool bLineWiggleTest = (c == ON::continuity::Gsmooth_continuous && m_order >= 4);
  bool bSpanIsLinear = false;

  if ( t0 < t1 )
  {
    int ii = ki+m_order-2;
    if ( t0 < m_knot[ii+1] && t1 > m_knot[ii+1] && (m_knot[ii+1]-t0) <= segtol && ii+2 < m_cv_count )
    {
      t0 = m_knot[ii+1];
      ki = ON_NurbsSpanIndex(m_order,m_cv_count,m_knot,t0,1,*hint);
    }
    if ( bLineWiggleTest )
      bSpanIsLinear = SpanIsLinear(ki,is_linear_min_length,is_linear_tolerance);
    *hint = ki;
    ki += m_order-2;
    while (ki < m_cv_count-1 && m_knot[ki] <= t0) 
      ki++;
    if (ki >= m_cv_count-1) 
    {
      if ( input_c != c && t0 < m_knot[m_cv_count-1] && t1 >= m_knot[m_cv_count-1] )
      {
        // have to do locus end test
        return ON_Curve::GetNextDiscontinuity( input_c, t0, t1, t, hint, dtype, 
                                    cos_angle_tolerance, curvature_tolerance );
      }
      return false;
    }
  }
  else
  {
    // (t0 > t1) work backwards
    int ii = ki+m_order-2;
    if ( t0 > m_knot[ii] && t1 < m_knot[ii] && (t0-m_knot[ii]) <= segtol && ii > m_order-2 )
    {
      t0 = m_knot[ii];
      ki = ON_NurbsSpanIndex(m_order,m_cv_count,m_knot,t0,-1,*hint);
    }
    if ( bLineWiggleTest )
      bSpanIsLinear = SpanIsLinear(ki,is_linear_min_length,is_linear_tolerance);
    *hint = ki;
    ki += m_order-2;
    while (ki > m_order-2 && m_knot[ki] >= t0) 
      ki--;
    if (ki <= m_order-2) 
    {
      if ( input_c != c && t0 > m_knot[m_order-2] && t1 < m_knot[m_order-2] )
      {
        // have to do locus end test
        return ON_Curve::GetNextDiscontinuity( input_c, t0, t1, t, hint, dtype, 
                                    cos_angle_tolerance, curvature_tolerance );
      }
      return false;
    }
    delta_ki = -1;
    delta = -delta;
  }

  double search_domain[2];
  if ( t0 <= t1 )
  {
    search_domain[0] = t0;
    search_domain[1] = t1;
  }
  else
  {
    search_domain[0] = t1;
    search_domain[1] = t0;
  }

  while ( search_domain[0] < m_knot[ki] && m_knot[ki] < search_domain[1] ) 
  {
    if ( delta_ki > 0 )
    {
      // t0 < t1 case
      while (ki < m_cv_count-1 && m_knot[ki] == m_knot[ki+1])
        ki++;
      if (ki >= m_cv_count-1) 
        break;    
    }
    else
    {
      // t0 > t1 case
      // 20 March 2003 Dale Lear:
      //     Added to make t0 > t1 case work
      while (ki > m_order-2 && m_knot[ki] == m_knot[ki-1])
        ki--;
      if (ki <= m_order-2) 
        break;    
    }

    if (m_knot[ki] == m_knot[ki+delta]) 
    {  
      if ( ON::continuity::Cinfinity_continuous == c )
      {
        // Cinfinity_continuous is treated as asking for the next knot
        *dtype = 3;
        *t = m_knot[ki];
        return true;
      }

      if ( bEv2ndDer ) {
        Ev2Der( m_knot[ki], Pm, D1m, D2m, -1, hint );
        Ev2Der( m_knot[ki], Pp, D1p, D2p,  1, hint );
      }
      else {
        Ev1Der( m_knot[ki], Pm, D1m, -1, hint );
        Ev1Der( m_knot[ki], Pp, D1p,  1, hint );
      }

      if ( bTestTangent )
      {
        if ( bTestKappa )
        {
          ON_EvCurvature( D1m, D2m, Tm, Km );
          ON_EvCurvature( D1p, D2p, Tp, Kp );
        }
        else
        {
          Tm = D1m;
          Tp = D1p;
          Tm.Unitize();
          Tp.Unitize();
        }
        
        d = Tm*Tp;
        if ( d < cos_angle_tolerance )
        {
          *dtype = 1;
          *t = m_knot[ki];
          return true;
        }
        
        if ( bTestKappa )
        {
          bool bIsCurvatureContinuous = ( ON::continuity::Gsmooth_continuous == c )
                  ? ON_IsGsmoothCurvatureContinuous( Km, Kp, cos_angle_tolerance, curvature_tolerance )
                  : ON_IsG2CurvatureContinuous( Km, Kp, cos_angle_tolerance, curvature_tolerance );
          if ( bIsCurvatureContinuous && ON::continuity::Gsmooth_continuous == c )
          {
            if ( ON_NurbsArcToArcTransitionIsNotGsmooth(*this,ki,cos_angle_tolerance,curvature_tolerance) )
              bIsCurvatureContinuous = false;
          }

          if ( !bIsCurvatureContinuous )
          {
            // NOTE:
            //   The test to enter this scope must exactly match
            //   the one used in ON_PolyCurve::GetNextDiscontinuity()
            //   and  ON_Curve::GetNextDiscontinuity().
            *dtype = 2;
            *t = m_knot[ki];
            return true;
          }
          if ( bLineWiggleTest )
          {
            if ( bSpanIsLinear != (( delta_ki < 0 )
                                  ? SpanIsLinear(ki - m_order + 1,is_linear_min_length,is_linear_tolerance)
                                  : SpanIsLinear(ki - m_order + 2,is_linear_min_length,is_linear_tolerance))
               )
            {
              // we are at a transition between a line segment and a wiggle
              *dtype = 3;
              *t = m_knot[ki];
              return true;
            }
          }
        }
      }
      else
      {
        if ( !(D1m-D1p).IsTiny(D1m.MaximumCoordinate()*ON_SQRT_EPSILON) )
        {
          *dtype = 1;
          *t = m_knot[ki];
          return true;
        }
        else if ( bEv2ndDer )
        {
          if ( !(D2m-D2p).IsTiny(D2m.MaximumCoordinate()*ON_SQRT_EPSILON) )
          {
            *dtype = 2;
            *t = m_knot[ki];
            return true;
          }         
        }
      }
    }
    ki += delta_ki;
  }

  // 20 March 2003 Dale Lear:
  //   If we get here, there are not discontinuities strictly between
  //   t0 and t1.
  bool rc = false;

  if ( input_c != c )
  {
    // use base class for consistent start/end locus testing 
    rc = ON_Curve::GetNextDiscontinuity( input_c, t0, t1, t, hint, dtype, 
                                    cos_angle_tolerance, curvature_tolerance );
  }

  return rc;
}